

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O3

void __thiscall doublechecked::Roaring::Roaring(Roaring *this,Roaring *other_plain)

{
  _Rb_tree_header *p_Var1;
  undefined4 uVar2;
  char cVar3;
  value_type value;
  RoaringSetBitBiDirectionalIterator __begin2;
  uint32_t local_5c;
  roaring_uint32_iterator_t local_58;
  
  (this->plain).roaring.high_low_container.keys = (uint16_t *)0x0;
  (this->plain).roaring.high_low_container.typecodes = (uint8_t *)0x0;
  (this->plain).roaring.high_low_container.size = 0;
  (this->plain).roaring.high_low_container.allocation_size = 0;
  (this->plain).roaring.high_low_container.containers = (container_s **)0x0;
  *(undefined8 *)&(this->plain).roaring.high_low_container.flags = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)this,0);
  p_Var1 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roaring::Roaring::operator=(&this->plain,other_plain);
  local_58.typecode = '\0';
  local_58.parent = (roaring_bitmap_t *)0x0;
  local_58.container = (void *)0x0;
  local_58.container_index = 0;
  local_58.highbits = 0;
  local_58.container_it.index = 0;
  local_58.current_value = 0;
  local_58.has_value = false;
  roaring_iterator_init((roaring_bitmap_t *)this,&local_58);
  if (roaring::Roaring::end()::e == '\0') {
    doublechecked::Roaring((doublechecked *)this);
  }
  cVar3 = roaring::Roaring::end()::e[0x24];
  uVar2 = roaring::Roaring::end()::e._32_4_;
  while ((local_58.current_value != uVar2 || (local_58.has_value != (_Bool)cVar3))) {
    local_5c = local_58.current_value;
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&this->check,&local_5c);
    roaring_uint32_iterator_advance(&local_58);
  }
  return;
}

Assistant:

Roaring(roaring::Roaring &&other_plain) {
        plain = std::move(other_plain);
        for (auto value : plain) check.insert(value);
    }